

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O3

uint sf::priv::RenderTextureImplFBO::getMaximumAntialiasingLevel(void)

{
  uint uVar1;
  TransientContextLock lock;
  GLint samples;
  TransientContextLock local_d;
  uint local_c;
  
  GlResource::TransientContextLock::TransientContextLock(&local_d);
  local_c = 0;
  (*sf_glad_glGetIntegerv)(0x8d57,(GLint *)&local_c);
  uVar1 = local_c;
  GlResource::TransientContextLock::~TransientContextLock(&local_d);
  return uVar1;
}

Assistant:

unsigned int RenderTextureImplFBO::getMaximumAntialiasingLevel()
{
    TransientContextLock lock;

    GLint samples = 0;

#ifndef SFML_OPENGL_ES

    glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

#endif

    return static_cast<unsigned int>(samples);
}